

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferSubDataUploadCase::init
          (BufferSubDataUploadCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  long lVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx_00;
  bool bVar4;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->
        super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Testing glBufferSubData() function call performance. ",0x35);
  pcVar3 = "Half of the buffer data is updated with glBufferSubData. ";
  bVar4 = this->m_fullUpload != false;
  if (bVar4) {
    pcVar3 = "The whole buffer is updated with glBufferSubData. ";
  }
  lVar2 = 0x39;
  if (bVar4) {
    lVar2 = 0x32;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  pcVar3 = "";
  bVar4 = this->m_invalidateBeforeUse != false;
  if (bVar4) {
    pcVar3 = "The buffer is cleared with glBufferData(..., NULL) before glBufferSubData upload.";
  }
  lVar2 = 0x51;
  if (!bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void BufferSubDataUploadCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glBufferSubData() function call performance. "
		<< ((m_fullUpload) ? ("The whole buffer is updated with glBufferSubData. ") : ("Half of the buffer data is updated with glBufferSubData. "))
		<< ((m_invalidateBeforeUse) ? ("The buffer is cleared with glBufferData(..., NULL) before glBufferSubData upload.") : ("")) << "\n"
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<SingleOperationDuration>::init();
}